

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall TPZMatrix<Fad<float>_>::Identity(TPZMatrix<Fad<float>_> *this)

{
  Fad<float> *this_00;
  long lVar1;
  long lVar2;
  Fad<float> local_70;
  Fad<float> local_50;
  
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("identity (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar1 = 0;
    do {
      if (0 < (this->super_TPZBaseMatrix).fCol) {
        lVar2 = 0;
        do {
          if (lVar1 == lVar2) {
            local_50.val_ = 1.0;
            local_50.dx_.num_elts = 0;
            local_50.dx_.ptr_to_data = (float *)0x0;
            local_50.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar1,lVar2,&local_50);
            this_00 = &local_50;
          }
          else {
            local_70.val_ = 0.0;
            local_70.dx_.num_elts = 0;
            local_70.dx_.ptr_to_data = (float *)0x0;
            local_70.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar1,lVar2,&local_70);
            this_00 = &local_70;
          }
          Fad<float>::~Fad(this_00);
          lVar2 = lVar2 + 1;
        } while (lVar2 < (this->super_TPZBaseMatrix).fCol);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}